

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_local(CTcParser *this,int *err)

{
  int iVar1;
  size_t len;
  long lVar2;
  bool bVar3;
  CTPNStmComp *pCVar4;
  tc_toktyp_t tVar5;
  CTcSymLocal *lcl;
  CTcSymLocal *expr;
  CTPNStmComp *pCVar6;
  int *err_00;
  CTPNStmComp *pCVar7;
  CTPNStmComp *local_40;
  
  expr = (CTcSymLocal *)err;
  CTcTokenizer::next(G_tok);
  pCVar7 = (CTPNStmComp *)0x0;
  local_40 = (CTPNStmComp *)0x0;
  do {
    bVar3 = false;
LAB_00234077:
    if (bVar3) {
      if (local_40 == (CTPNStmComp *)0x0) {
        pCVar6 = (CTPNStmComp *)0x0;
      }
      else {
        pCVar6 = local_40;
        if (local_40 != pCVar7) {
          pCVar6 = (CTPNStmComp *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)expr);
          CTPNStmComp::CTPNStmComp(pCVar6,(CTPNStm *)local_40,this->local_symtab_);
        }
      }
      return (CTPNStm *)pCVar6;
    }
    if ((G_tok->curtok_).typ_ == TOKT_SYM) {
      expr = (CTcSymLocal *)(G_tok->curtok_).text_;
      len = (G_tok->curtok_).text_len_;
      iVar1 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar1) {
        this->max_local_cnt_ = iVar1 + 1;
      }
      this->local_cnt_ = iVar1 + 1;
      lcl = CTcPrsSymtab::add_local(this->local_symtab_,(textchar_t *)expr,len,iVar1,0,0,0);
      tVar5 = CTcTokenizer::next(G_tok);
      pCVar6 = pCVar7;
      pCVar4 = local_40;
      if ((tVar5 == TOKT_ASI) || (bVar3 = false, tVar5 == TOKT_EQ)) {
        expr = (CTcSymLocal *)parse_local_initializer(this,lcl,err_00);
        if (expr == (CTcSymLocal *)0x0) {
          expr = lcl;
          bVar3 = true;
        }
        else {
          pCVar6 = (CTPNStmComp *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)lcl);
          CTPNStmExpr::CTPNStmExpr((CTPNStmExpr *)pCVar6,(CTcPrsNode *)expr);
          lVar2 = G_tok->last_linenum_;
          (pCVar6->super_CTPNStmCompBase).super_CTPNStm.super_CTPNStmBase.file_ = G_tok->last_desc_;
          (pCVar6->super_CTPNStmCompBase).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar2;
          pCVar4 = pCVar6;
          bVar3 = false;
          if (pCVar7 != (CTPNStmComp *)0x0) {
            (pCVar7->super_CTPNStmCompBase).super_CTPNStm.super_CTPNStmBase.next_stm_ =
                 (CTPNStm *)pCVar6;
            pCVar4 = local_40;
          }
        }
      }
      local_40 = pCVar4;
      tVar5 = (G_tok->curtok_).typ_;
      pCVar7 = pCVar6;
      if (tVar5 != TOKT_SYM) {
        if (tVar5 == TOKT_SEM) {
          CTcTokenizer::next(G_tok);
        }
        else {
          if (tVar5 == TOKT_COMMA) {
            CTcTokenizer::next(G_tok);
            goto LAB_00234077;
          }
          expr = (CTcSymLocal *)0x2b28;
          CTcTokenizer::log_error_curtok(G_tok,0x2b28);
        }
        bVar3 = true;
        goto LAB_00234077;
      }
      expr = (CTcSymLocal *)0x2b28;
      CTcTokenizer::log_error_curtok(G_tok,0x2b28);
      goto LAB_00234077;
    }
    expr = (CTcSymLocal *)0x2b29;
    CTcTokenizer::log_error_curtok(G_tok,0x2b29);
    tVar5 = (G_tok->curtok_).typ_;
    if (tVar5 == TOKT_EOF) {
      *err = 1;
      bVar3 = true;
      goto LAB_00234077;
    }
    if (tVar5 == TOKT_SEM) {
      CTcTokenizer::next(G_tok);
      bVar3 = true;
      goto LAB_00234077;
    }
    CTcTokenizer::next(G_tok);
  } while( true );
}

Assistant:

CTPNStm *CTcParser::parse_local(int *err)
{
    int done;
    CTPNStm *first_stm;
    CTPNStm *last_stm;

    /* we have no initializer statements yet */
    first_stm = last_stm = 0;

    /* skip the 'local' keyword */
    G_tok->next();

    /* keep going until we reach the closing semicolon */
    for (done = FALSE ; !done ; )
    {
        /* we need a symbol name */
        if (G_tok->cur() == TOKT_SYM)
        {
            const char *sym;
            size_t symlen;
            CTcSymLocal *lcl;
            CTPNStm *stm;
            CTcPrsNode *expr;
            
            /* get the symbol string from the token */
            sym = G_tok->getcur()->get_text();
            symlen = G_tok->getcur()->get_text_len();
            
            /* add the new local variable to our symbol table */
            lcl = local_symtab_->add_local(sym, symlen, alloc_local(),
                                           FALSE, FALSE, FALSE);

            /* skip the symbol and check for an initial value assignment */
            switch (G_tok->next())
            {
            case TOKT_EQ:
            case TOKT_ASI:
                /* parse the initializer */
                expr = parse_local_initializer(lcl, err);

                /* if we didn't get a statement, we can't proceed */
                if (expr == 0)
                {
                    done = TRUE;
                    break;
                }

                /* create a statement for the assignment */
                stm = new CTPNStmExpr(expr);

                /* 
                 *   set the statement's source location according to the
                 *   current source location - if we have multiple
                 *   initializers over several lines, this will allow the
                 *   debugger to step through the individual
                 *   initializations 
                 */
                stm->set_source_pos(G_tok->get_last_desc(),
                                    G_tok->get_last_linenum());

                /* add the statement to our list */
                if (last_stm != 0)
                    last_stm->set_next_stm(stm);
                else
                    first_stm = stm;
                last_stm = stm;

                /* done */
                break;

            default:
                /* there's nothing more to do with this variable */
                break;
            }

            /* 
             *   check what follows - we can have a comma to introduce
             *   another local variable, or a semicolon to end the
             *   statement 
             */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* skip the comma and go on to the next variable */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* skip the semicolon, and stop scanning */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_SYM:
                /* 
                 *   they probably just left out a comma - assume the
                 *   comma is there and keep going 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                break;

            default:
                /* 
                 *   these almost certainly indicate that they left out a
                 *   semicolon - report the error and continue from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                done = TRUE;
                break;
            }
        }
        else
        {
            /* symbol required - log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);

            /* determine how to proceed based on what we have */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* 
                 *   they probably just put in an extra comma - skip it
                 *   and keep trying to parse the local list 
                 */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* that's the end of the statement */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_EOF:
                /* set the error flag and stop scanning */
                *err = TRUE;
                done = TRUE;
                break;

            default:
                /* try skipping this token and trying again */
                G_tok->next();
                break;
            }
        }
    }

    /* 
     *   if we have one statement, return it; if we have more than one,
     *   return a compound statement to contain the list; if we have
     *   nothing, return nothing 
     */
    if (first_stm == 0)
        return 0;
    else if (first_stm == last_stm)
        return first_stm;
    else
        return new CTPNStmComp(first_stm, local_symtab_);
}